

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::Test::RecordProperty(char *key,int value)

{
  char *value_00;
  Message in_stack_ffffffffffffffc0;
  Message local_20;
  Message value_message;
  int value_local;
  char *key_local;
  
  value_message.ss_.ptr_._4_4_ = value;
  Message::Message((Message *)in_stack_ffffffffffffffc0.ss_.ptr_);
  Message::operator<<(&local_20,(int *)((long)&value_message.ss_.ptr_ + 4));
  Message::GetString((Message *)&stack0xffffffffffffffc0);
  value_00 = internal::String::c_str((String *)&stack0xffffffffffffffc0);
  RecordProperty(key,value_00);
  internal::String::~String((String *)key);
  Message::~Message((Message *)0x14c4a2);
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}